

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void compact_array_suite::test_uint64_many(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  output_type expected [34];
  undefined1 local_c6 [14];
  uint64_t value [4];
  oarchive ar;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&ar,&result);
  value[2] = 0x8000000000000000;
  value[3] = 0xffffffffffffffff;
  value[0] = 0;
  value[1] = 0x7fffffffffffffff;
  trial::protocol::bintoken::oarchive::save_override<unsigned_long[4]>
            (&ar,(unsigned_long (*) [4])value);
  expected[0x10] = 0xff;
  expected[0x11] = '\x7f';
  expected[0x12] = '\0';
  expected[0x13] = '\0';
  expected[0x14] = '\0';
  expected[0x15] = '\0';
  expected[0x16] = '\0';
  expected[0x17] = '\0';
  expected[0x18] = '\0';
  expected[0x19] = 0x80;
  expected[0x1a] = 0xff;
  expected[0x1b] = 0xff;
  expected[0x1c] = 0xff;
  expected[0x1d] = 0xff;
  expected[0x1e] = 0xff;
  expected[0x1f] = 0xff;
  expected[0x20] = 0xff;
  expected[0x21] = 0xff;
  expected[0] = 0xae;
  expected[1] = ' ';
  expected[2] = '\0';
  expected[3] = '\0';
  expected[4] = '\0';
  expected[5] = '\0';
  expected[6] = '\0';
  expected[7] = '\0';
  expected[8] = '\0';
  expected[9] = '\0';
  expected[10] = 0xff;
  expected[0xb] = 0xff;
  expected[0xc] = 0xff;
  expected[0xd] = 0xff;
  expected[0xe] = 0xff;
  expected[0xf] = 0xff;
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x23f,"void compact_array_suite::test_uint64_many()",
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,local_c6);
  trial::protocol::bintoken::oarchive::~oarchive(&ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    int value = 0;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
}